

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O1

void setFitting(Settings *s,Data *d)

{
  int iVar1;
  double *pdVar2;
  ostream *poVar3;
  long *plVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (s->fit == true) {
    pdVar5 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar6 = pdVar5 + 1;
    pdVar7 = pdVar6;
    pdVar9 = pdVar5;
    if (pdVar6 != pdVar2 && pdVar5 != pdVar2) {
      do {
        pdVar8 = pdVar7;
        if (*pdVar9 < *pdVar7 || *pdVar9 == *pdVar7) {
          pdVar8 = pdVar9;
        }
        pdVar7 = pdVar7 + 1;
        pdVar9 = pdVar8;
      } while (pdVar7 != pdVar2);
      s->minx = *pdVar8;
      if (pdVar6 != pdVar2 && pdVar5 != pdVar2) {
        do {
          pdVar7 = pdVar6;
          if (*pdVar6 < *pdVar5 || *pdVar6 == *pdVar5) {
            pdVar7 = pdVar5;
          }
          pdVar5 = pdVar7;
          pdVar6 = pdVar6 + 1;
        } while (pdVar6 != pdVar2);
      }
    }
    else {
      s->minx = *pdVar5;
    }
    s->maxx = *pdVar5;
    pdVar5 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar6 = pdVar5 + 1;
    pdVar7 = pdVar6;
    pdVar9 = pdVar5;
    if (pdVar6 != pdVar2 && pdVar5 != pdVar2) {
      do {
        pdVar8 = pdVar7;
        if (*pdVar9 < *pdVar7 || *pdVar9 == *pdVar7) {
          pdVar8 = pdVar9;
        }
        pdVar7 = pdVar7 + 1;
        pdVar9 = pdVar8;
      } while (pdVar7 != pdVar2);
      s->miny = *pdVar8;
      if (pdVar6 != pdVar2 && pdVar5 != pdVar2) {
        do {
          pdVar7 = pdVar6;
          if (*pdVar6 < *pdVar5 || *pdVar6 == *pdVar5) {
            pdVar7 = pdVar5;
          }
          pdVar5 = pdVar7;
          pdVar6 = pdVar6 + 1;
        } while (pdVar6 != pdVar2);
      }
    }
    else {
      s->miny = *pdVar5;
    }
    s->maxy = *pdVar5;
    if (s->mapType != heat) {
      pdVar5 = (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = pdVar5 + 1;
      pdVar7 = pdVar6;
      pdVar9 = pdVar5;
      if (pdVar6 != pdVar2 && pdVar5 != pdVar2) {
        do {
          pdVar8 = pdVar7;
          if (*pdVar9 < *pdVar7 || *pdVar9 == *pdVar7) {
            pdVar8 = pdVar9;
          }
          pdVar7 = pdVar7 + 1;
          pdVar9 = pdVar8;
        } while (pdVar7 != pdVar2);
        s->mins = *pdVar8;
        if (pdVar6 != pdVar2 && pdVar5 != pdVar2) {
          do {
            pdVar7 = pdVar6;
            if (*pdVar6 < *pdVar5 || *pdVar6 == *pdVar5) {
              pdVar7 = pdVar5;
            }
            pdVar5 = pdVar7;
            pdVar6 = pdVar6 + 1;
          } while (pdVar6 != pdVar2);
        }
      }
      else {
        s->mins = *pdVar5;
      }
      s->maxs = *pdVar5;
    }
  }
  if (s->fitnx == true) {
    dVar13 = s->maxx;
    dVar14 = s->miny;
    dVar11 = s->maxy;
    dVar12 = s->minx;
    iVar1 = s->ny;
    dVar10 = cos(((dVar14 + dVar11) * 0.5 * pi) / 180.0);
    s->nx = (int)((dVar10 * (double)iVar1 * (dVar13 - dVar12)) / (dVar11 - dVar14));
  }
  if (s->fitny == true) {
    dVar13 = s->maxx;
    dVar14 = s->miny;
    dVar11 = s->maxy;
    dVar12 = s->minx;
    iVar1 = s->nx;
    dVar10 = cos(((dVar14 + dVar11) * 0.5 * pi) / 180.0);
    s->ny = (int)((((double)iVar1 / dVar10) * (dVar11 - dVar14)) / (dVar13 - dVar12));
  }
  if (s->fitx == true) {
    dVar13 = s->miny;
    dVar11 = (s->minx + s->maxx) * 0.5;
    dVar14 = s->maxy;
    dVar12 = cos(((dVar13 + dVar14) * 0.5 * pi) / 180.0);
    dVar13 = ((double)s->nx * ((dVar14 - dVar13) / dVar12)) / (double)s->ny;
    s->minx = dVar13 * -0.5 + dVar11;
    s->maxx = dVar13 * 0.5 + dVar11;
  }
  if (s->fity == true) {
    dVar13 = s->maxx;
    dVar12 = (s->miny + s->maxy) * 0.5;
    dVar14 = s->minx;
    dVar11 = cos((pi * dVar12) / 180.0);
    dVar13 = (((double)s->ny * dVar11) / (double)s->nx) * (dVar13 - dVar14);
    s->miny = dVar13 * -0.5 + dVar12;
    s->maxy = dVar13 * 0.5 + dVar12;
  }
  dVar13 = (s->maxx - s->minx) * s->margin;
  s->minx = s->minx - dVar13;
  s->maxx = dVar13 + s->maxx;
  dVar13 = (s->maxy - s->miny) * s->margin;
  s->miny = s->miny - dVar13;
  s->maxy = dVar13 + s->maxy;
  if ((s->fitnx != false) || (s->fitny == true)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Resizing image to ",0x12);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,s->nx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    plVar4 = (long *)std::ostream::operator<<((ostream *)poVar3,s->ny);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  if ((((s->fit != false) || (s->fitx != false)) || (s->fity != false)) ||
     ((s->margin != 0.0 || (NAN(s->margin))))) {
    printBounds(s);
  }
  if (s->mapType != heat) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    poVar3 = std::ostream::_M_insert<double>(s->mins);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," <= scalar <= ",0xe);
    poVar3 = std::ostream::_M_insert<double>(s->maxs);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  dVar14 = s->maxx - s->minx;
  dVar13 = s->maxy - s->miny;
  dVar13 = dVar13 * dVar13 + dVar14 * dVar14;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar14 = (double)s->ny * (double)s->ny + (double)s->nx * (double)s->nx;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  s->degPerPix = dVar13 / dVar14;
  if (s->sampling == autosample) {
    dVar13 = getAvgLength(s,d);
    s->sampling = (uint)(0.5 <= dVar13 / (double)s->r) * 2;
  }
  return;
}

Assistant:

void setFitting(Settings& s, Data& d)
{
	// Get the image bounds depending on which input options were
	// specified, and from the zoom level, set the sampling
	// strategy.

	if (s.fit)
	{
		s.minx = *min_element(begin(d.lons), end(d.lons));
		s.maxx = *max_element(begin(d.lons), end(d.lons));
		s.miny = *min_element(begin(d.lats), end(d.lats));
		s.maxy = *max_element(begin(d.lats), end(d.lats));

		if (s.mapType != heat)
		{
			s.mins = *min_element(begin(d.scas), end(d.scas));
			s.maxs = *max_element(begin(d.scas), end(d.scas));
		}
	}

	if (s.fitnx)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.nx = s.ny * cos(avgy * pi / 180.0) * difx / dify;
	}

	if (s.fitny)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.ny = s.nx / cos(avgy * pi / 180.0) * dify / difx;
	}

	if (s.fitx)
	{
		double avgx = 0.5 * (s.minx + s.maxx);
		double avgy = 0.5 * (s.miny + s.maxy);
		double dify = s.maxy - s.miny;
		double difx = dify / cos(avgy * pi / 180.0) * s.nx / s.ny;
		s.minx = avgx - 0.5 * difx;
		s.maxx = avgx + 0.5 * difx;
	}

	if (s.fity)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = cos(avgy * pi / 180.0) * s.ny / s.nx * difx;
		s.miny = avgy - 0.5 * dify;
		s.maxy = avgy + 0.5 * dify;
	}

	double difx = s.maxx - s.minx;
	double dify = s.maxy - s.miny;
	s.minx -= s.margin * difx;
	s.maxx += s.margin * difx;
	s.miny -= s.margin * dify;
	s.maxy += s.margin * dify;

	if (s.fitnx || s.fitny)
	{
		std::cout << "Resizing image to " << s.nx << ", " << s.ny << std::endl;
	}

	if (s.fit || s.fitx || s.fity || s.margin != 0.0)
		printBounds(s);

	if (s.mapType != heat)
		std::cout << "\t" << s.mins << " <= scalar <= " << s.maxs << std::endl;

	s.degPerPix
			= sqrt(pow(s.maxx - s.minx, 2) + pow(s.maxy - s.miny, 2))
			/ sqrt(pow(s.nx           , 2) + pow(s.ny           , 2));

	if (s.sampling == autosample)
	{
		double lenavgpix = getAvgLength(s, d);
		if (lenavgpix / s.r < 0.5)  // TODO:  this limit depends on kernel type
			s.sampling = pointwise;
		else
			s.sampling = linear;
	}
}